

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZEqnArray<long_double>_> * __thiscall
TPZVec<TPZEqnArray<long_double>_>::operator=
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  TPZEqnArray<long_double> *pTVar5;
  TPZEqnArray<long_double> *pTVar6;
  TPZVec<TPZEqnArray<long_double>_> *in_RSI;
  TPZVec<TPZEqnArray<long_double>_> *in_RDI;
  ulong uVar7;
  int64_t i;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff58;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff60;
  TPZEqnArray<long_double> *local_80;
  TPZEqnArray<long_double> *pTVar8;
  long local_28;
  
  if (in_RDI != in_RSI) {
    in_RDI->fNElements = in_RSI->fNElements;
    if ((in_RDI->fStore != (TPZEqnArray<long_double> *)0x0) &&
       (pTVar8 = in_RDI->fStore, pTVar8 != (TPZEqnArray<long_double> *)0x0)) {
      lVar1 = *(long *)&pTVar8[-1].field_0x51d8;
      for (pTVar5 = pTVar8 + lVar1; pTVar8 != pTVar5; pTVar5 = pTVar5 + -1) {
        TPZEqnArray<long_double>::~TPZEqnArray(in_stack_ffffffffffffff60);
      }
      operator_delete__(&pTVar8[-1].fLastTerm,lVar1 * 0x51e0 + 0x10);
    }
    if (in_RSI->fNAlloc == 0) {
      pTVar8 = (TPZEqnArray<long_double> *)in_RDI->fNElements;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pTVar8;
      uVar3 = SUB168(auVar2 * ZEXT816(0x51e0),0);
      uVar7 = uVar3 + 0x10;
      if (SUB168(auVar2 * ZEXT816(0x51e0),8) != 0 || 0xffffffffffffffef < uVar3) {
        uVar7 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar7);
      *(TPZEqnArray<long_double> **)((long)pvVar4 + 8) = pTVar8;
      pTVar5 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
      if (pTVar8 != (TPZEqnArray<long_double> *)0x0) {
        pTVar6 = pTVar5 + (long)pTVar8;
        local_80 = pTVar5;
        do {
          TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
          local_80 = local_80 + 1;
        } while (local_80 != pTVar6);
      }
      in_RDI->fStore = pTVar5;
      for (local_28 = 0; local_28 < in_RDI->fNElements; local_28 = local_28 + 1) {
        TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    else {
      in_RDI->fStore = in_RSI->fStore;
    }
    in_RDI->fNAlloc = in_RDI->fNElements;
    in_RSI->fStore = (TPZEqnArray<long_double> *)0x0;
    in_RSI->fNElements = 0;
    in_RSI->fNAlloc = 0;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}